

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O1

double __thiscall chrono::ChSolverAPGD::Solve(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer ppCVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ChConstraint *pCVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChVectorDynamic<> *pCVar15;
  ChVectorDynamic<> *pCVar16;
  int iVar17;
  Index size;
  pointer ppCVar18;
  char *pcVar19;
  Index index;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ChSystemDescriptor *pCVar23;
  long lVar24;
  ActualDstType actualDst_1;
  ChVectorDynamic<> *pCVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  double dVar30;
  Scalar SVar31;
  Scalar mdeltalambda;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  ActualDstType actualDst_2;
  ActualDstType actualDst_5;
  ActualDstType actualDst_6;
  ActualDstType actualDst;
  ChVectorDynamic<> Minvk;
  scalar_sum_op<double,_double> local_179;
  double local_178;
  ChVectorDynamic<> *local_170;
  ChVectorDynamic<> *local_168;
  plainobjectbase_evaluator_data<double,_0> local_160;
  double local_158;
  undefined8 uStack_150;
  ChVectorDynamic<> *local_140;
  ChVectorDynamic<> *local_138;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  ChVectorDynamic<> *local_110;
  ChSystemDescriptor *local_108;
  undefined1 local_100 [24];
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_e8;
  scalar_constant_op<double> local_e0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_c8;
  undefined1 local_c0 [16];
  ChVectorDynamic<> *local_b0;
  variable_if_dynamic<long,__1> local_a8;
  plainobjectbase_evaluator_data<double,_0> local_a0;
  scalar_constant_op<double> local_98;
  plainobjectbase_evaluator_data<double,_0> local_90;
  ChVectorDynamic<> *local_80;
  double local_68;
  undefined8 uStack_60;
  ChVectorDynamic<> *local_50;
  long local_48 [2];
  double local_38;
  
  ppCVar18 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar18) {
    uVar21 = 0;
    uVar22 = 1;
    do {
      (*ppCVar18[uVar21]->_vptr_ChConstraint[6])();
      ppCVar18 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = uVar22 < (ulong)((long)(sysd->vconstraints).
                                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar18 >>
                               3);
      uVar21 = uVar22;
      uVar22 = (ulong)((int)uVar22 + 1);
    } while (bVar10);
  }
  iVar17 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  this->nc = iVar17;
  local_110 = &this->gamma_hat;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar17
            );
  this_00 = &this->gammaNew;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->nc
            );
  local_138 = &this->g;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  pCVar25 = &this->y;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->nc
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_170 = &this->yNew;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_50 = &this->r;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_168 = &this->tmp;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  this->residual = 1e+31;
  ShurBvectorCompute(this,sysd);
  if (this->nc == 0) {
    return 0.0;
  }
  local_48[0] = 0;
  local_48[1] = 0;
  local_160.data = (double *)&this->gamma;
  (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,local_48,1);
  ppCVar18 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_108 = sysd;
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    lVar24 = (long)ppCVar4 - (long)ppCVar18;
    if (lVar24 != 0) {
      uVar21 = 0;
      do {
        ppCVar18[uVar21]->l_i = 0.0;
        uVar21 = uVar21 + 1;
      } while ((uVar21 & 0xffffffff) < (ulong)(lVar24 >> 3));
    }
  }
  else if (ppCVar4 != ppCVar18) {
    uVar21 = 0;
    uVar22 = 1;
    do {
      if (ppCVar18[uVar21]->active == true) {
        (*ppCVar18[uVar21]->_vptr_ChConstraint[8])();
      }
      ppCVar18 = (local_108->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = uVar22 < (ulong)((long)(local_108->vconstraints).
                                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar18 >>
                               3);
      uVar21 = uVar22;
      uVar22 = (ulong)((int)uVar22 + 1);
    } while (bVar10);
  }
  pCVar23 = local_108;
  (*local_108->_vptr_ChSystemDescriptor[0x12])(local_108,local_160.data,1);
  lVar24 = (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (-1 < lVar24) {
    if (lVar24 != 0) {
      pdVar5 = (local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      lVar20 = 0;
      do {
        *(undefined8 *)((long)pdVar5 + lVar20) = 0x3ff0000000000000;
        lVar20 = lVar20 + 8;
      } while (lVar24 << 3 != lVar20);
    }
    pdVar5 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar21 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        uVar21) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar21,1);
    }
    uVar22 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (uVar22 != uVar21) {
LAB_007dba8e:
      pcVar19 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007dba81:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar19);
    }
    pdVar6 = (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar21 = uVar22 + 7;
    if (-1 < (long)uVar22) {
      uVar21 = uVar22;
    }
    uVar21 = uVar21 & 0xfffffffffffffff8;
    if (7 < (long)uVar22) {
      lVar24 = 0;
      do {
        *(undefined1 (*) [64])(pdVar6 + lVar24) = *(undefined1 (*) [64])(pdVar5 + lVar24);
        lVar24 = lVar24 + 8;
      } while (lVar24 < (long)uVar21);
    }
    if ((long)uVar21 < (long)uVar22) {
      do {
        pdVar6[uVar21] = pdVar5[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar22 != uVar21);
    }
    uVar21 = (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    local_140 = pCVar25;
    if ((this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar21) {
LAB_007dba1c:
      pcVar19 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007dba5f:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar19);
    }
    pdVar5 = (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar6 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    if ((this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != uVar21) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar21,1
                );
    }
    pCVar25 = local_140;
    uVar22 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (uVar22 != uVar21) {
      pcVar19 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_007dba81;
    }
    pdVar7 = (local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar21 = uVar22 + 7;
    if (-1 < (long)uVar22) {
      uVar21 = uVar22;
    }
    uVar21 = uVar21 & 0xfffffffffffffff8;
    if (7 < (long)uVar22) {
      lVar24 = 0;
      do {
        auVar27 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar6 + lVar24),
                                 *(undefined1 (*) [64])(pdVar5 + lVar24));
        *(undefined1 (*) [64])(pdVar7 + lVar24) = auVar27;
        lVar24 = lVar24 + 8;
      } while (lVar24 < (long)uVar21);
    }
    if ((long)uVar21 < (long)uVar22) {
      do {
        pdVar7[uVar21] = pdVar6[uVar21] - pdVar5[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar22 != uVar21);
    }
    local_100._0_8_ = local_168;
    lVar24 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar24 == 0) {
      local_158 = 0.0;
      uStack_150 = 0;
    }
    else {
      if (lVar24 < 1) goto LAB_007dbb69;
      local_c0._8_8_ =
           (local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
      local_158 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                  ::
                  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                            ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)local_c0,&local_179,
                             (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)local_100);
      uStack_150 = extraout_XMM0_Qb;
    }
    (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,local_170,local_168,0);
    local_100._0_8_ = local_170;
    lVar24 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar24 == 0) {
      dVar30 = 0.0;
      uVar34 = 0;
    }
    else {
      if (lVar24 < 1) {
LAB_007dbb69:
        pcVar19 = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
        ;
LAB_007dba0f:
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar19);
      }
      local_c0._8_8_ =
           (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
      dVar30 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_c0,&local_179,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)local_100);
      uVar34 = extraout_XMM0_Qb_00;
    }
    lVar24 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (-1 < lVar24) {
      if (lVar24 != 0) {
        local_128 = dVar30;
        uStack_120 = uVar34;
        memset((local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data,0,lVar24 << 3);
        dVar30 = local_128;
      }
      (this->super_ChIterativeSolverVI).m_iterations = 0;
      if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_158;
        auVar26 = vsqrtpd_avx(auVar26);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar30;
        auVar35 = vsqrtpd_avx(auVar35);
        local_158 = auVar35._0_8_ / auVar26._0_8_;
        local_128 = 1.0 / local_158;
        uStack_120 = 0;
        local_68 = 1.0;
        uStack_60 = 0;
        do {
          (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,local_138,pCVar25,0);
          uVar21 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar21) {
            pcVar19 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007dba5f;
          }
          if ((long)uVar21 < 0) goto LAB_007db99f;
          if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar21) {
            pcVar19 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
            ;
            goto LAB_007dba5f;
          }
          pdVar5 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar6 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar7 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != uVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar21,1);
          }
          pCVar23 = local_108;
          uVar22 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (uVar22 != uVar21) {
            pcVar19 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
            ;
            goto LAB_007dba81;
          }
          pdVar8 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar21 = uVar22 + 7;
          if (-1 < (long)uVar22) {
            uVar21 = uVar22;
          }
          uVar21 = uVar21 & 0xfffffffffffffff8;
          if (7 < (long)uVar22) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_128;
            auVar27 = vbroadcastsd_avx512f(auVar1);
            lVar24 = 0;
            do {
              auVar28 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar6 + lVar24),
                                       *(undefined1 (*) [64])(pdVar7 + lVar24));
              auVar28 = vmulpd_avx512f(auVar27,auVar28);
              auVar28 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar5 + lVar24),auVar28);
              *(undefined1 (*) [64])(pdVar8 + lVar24) = auVar28;
              lVar24 = lVar24 + 8;
            } while (lVar24 < (long)uVar21);
          }
          if ((long)uVar21 < (long)uVar22) {
            do {
              pdVar8[uVar21] = pdVar5[uVar21] - local_128 * (pdVar6[uVar21] + pdVar7[uVar21]);
              uVar21 = uVar21 + 1;
            } while (uVar22 != uVar21);
          }
          (*local_108->_vptr_ChSystemDescriptor[0x18])(local_108,this_00);
          pCVar16 = local_50;
          pCVar15 = local_140;
          pCVar25 = local_168;
          (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,local_168,this_00,0);
          pdVar5 = (double *)
                   (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)pdVar5 < 0) goto LAB_007db99f;
          pdVar6 = (double *)
                   (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (pdVar5 != pdVar6) {
LAB_007db9be:
            pcVar19 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007dba5f;
          }
          if ((double *)
              (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != pdVar6) {
LAB_007db9d8:
            pcVar19 = 
            "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
            ;
LAB_007db9ed:
            __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",0x52,
                          pcVar19);
          }
          local_98.m_other = 0.5;
          local_90.data = (double *)pCVar25;
          local_80 = pCVar16;
          local_c0._0_8_ = this_00;
          local_a8.m_value = (long)pdVar5;
          if (pdVar6 != (double *)0x0) {
            if (0 < (long)pdVar6) {
              local_100._8_8_ =
                   (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_e0.m_other = 0.5;
              local_d0.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_c8.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_178 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                          ::
                          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                      *)local_100,&local_179,
                                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)local_c0);
              goto LAB_007daeab;
            }
LAB_007db9fa:
            local_98.m_other = 0.5;
            pcVar19 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            goto LAB_007dba0f;
          }
          local_178 = 0.0;
LAB_007daeab:
          (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,pCVar25,pCVar15,0);
          pdVar5 = (double *)
                   (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)pdVar5 < 0) goto LAB_007db99f;
          pdVar6 = (double *)
                   (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (pdVar5 != pdVar6) goto LAB_007db9be;
          if ((double *)
              (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != pdVar6) goto LAB_007db9d8;
          local_c0._0_8_ = pCVar15;
          local_98.m_other = 0.5;
          local_90.data = (double *)pCVar25;
          local_80 = pCVar16;
          local_a8.m_value = (long)pdVar5;
          if (pdVar6 == (double *)0x0) {
            dVar30 = 0.0;
          }
          else {
            if ((long)pdVar6 < 1) goto LAB_007db9fa;
            local_100._8_8_ =
                 (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_e0.m_other = 0.5;
            local_d0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_c8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (pCVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            dVar30 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_100,&local_179,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_c0);
          }
          local_100._8_8_ = pCVar15;
          pCVar25 = (ChVectorDynamic<> *)
                    (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
          local_100._0_8_ = this_00;
          if ((ChVectorDynamic<> *)
              (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != pCVar25) goto LAB_007dba1c;
          local_130 = dVar30;
          if ((long)pCVar25 < 0) {
LAB_007db99f:
            pcVar19 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007db9b4;
          }
          local_a0.data = (double *)(local_158 * 0.5);
          local_c0._0_8_ = local_138;
          local_90.data = (double *)pCVar15;
          local_b0 = pCVar25;
          if ((ChVectorDynamic<> *)
              (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != pCVar25) {
LAB_007dba33:
            pcVar19 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
            ;
            local_100._0_8_ = this_00;
            local_100._8_8_ = local_90.data;
            local_c0._0_8_ = local_138;
            local_98.m_other = (double)this_00;
            goto LAB_007dba5f;
          }
          local_98.m_other = (double)this_00;
          dVar30 = Eigen::
                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
                   ::
                   dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
                             ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               *)local_100,
                              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                               *)local_c0);
          while (dVar30 + local_130 <= local_178) {
            uVar21 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((long)uVar21 < 0) goto LAB_007db99f;
            if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != uVar21) {
              pcVar19 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_007dba5f;
            }
            pdVar5 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            pdVar6 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != uVar21) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         uVar21,1);
            }
            uVar22 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
            if (uVar22 != uVar21) {
              pcVar19 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
              ;
              goto LAB_007dba81;
            }
            local_158 = local_158 + local_158;
            local_128 = 1.0 / local_158;
            uStack_120 = 0;
            pdVar7 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            uVar21 = uVar22 + 7;
            if (-1 < (long)uVar22) {
              uVar21 = uVar22;
            }
            uVar21 = uVar21 & 0xfffffffffffffff8;
            if (7 < (long)uVar22) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_128;
              auVar27 = vbroadcastsd_avx512f(auVar2);
              lVar24 = 0;
              do {
                auVar28 = vmulpd_avx512f(auVar27,*(undefined1 (*) [64])(pdVar6 + lVar24));
                auVar28 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar5 + lVar24),auVar28);
                *(undefined1 (*) [64])(pdVar7 + lVar24) = auVar28;
                lVar24 = lVar24 + 8;
              } while (lVar24 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar22) {
              do {
                pdVar7[uVar21] = pdVar5[uVar21] - local_128 * pdVar6[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar22 != uVar21);
            }
            (*pCVar23->_vptr_ChSystemDescriptor[0x18])(pCVar23,this_00);
            pCVar16 = local_50;
            pCVar15 = local_140;
            pCVar25 = local_168;
            (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,local_168,this_00,0);
            pdVar5 = (double *)
                     (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((long)pdVar5 < 0) goto LAB_007db99f;
            pdVar6 = (double *)
                     (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (pdVar5 != pdVar6) goto LAB_007db9be;
            if ((double *)
                (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != pdVar6) goto LAB_007db9d8;
            local_98.m_other = 0.5;
            local_90.data = (double *)pCVar25;
            local_80 = pCVar16;
            local_a8.m_value = (long)pdVar5;
            if (pdVar6 == (double *)0x0) {
              local_178 = 0.0;
              local_c0._0_8_ = this_00;
            }
            else {
              local_c0._0_8_ = this_00;
              if ((long)pdVar6 < 1) goto LAB_007db9fa;
              local_100._8_8_ =
                   (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_e0.m_other = 0.5;
              local_d0.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_c8.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_178 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                          ::
                          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                      *)local_100,&local_179,
                                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)local_c0);
            }
            (*pCVar23->_vptr_ChSystemDescriptor[0x16])(pCVar23,pCVar25,pCVar15,0);
            pdVar5 = (double *)
                     (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((long)pdVar5 < 0) goto LAB_007db99f;
            pdVar6 = (double *)
                     (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (pdVar5 != pdVar6) goto LAB_007db9be;
            if ((double *)
                (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != pdVar6) goto LAB_007db9d8;
            local_c0._0_8_ = pCVar15;
            local_98.m_other = 0.5;
            local_90.data = (double *)pCVar25;
            local_80 = pCVar16;
            local_a8.m_value = (long)pdVar5;
            if (pdVar6 == (double *)0x0) {
              dVar30 = 0.0;
            }
            else {
              if ((long)pdVar6 < 1) goto LAB_007db9fa;
              local_100._8_8_ =
                   (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_e0.m_other = 0.5;
              local_d0.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_c8.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (pCVar16->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              dVar30 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                 ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                   *)local_100,&local_179,
                                  (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_c0);
            }
            local_100._8_8_ = pCVar15;
            pCVar25 = (ChVectorDynamic<> *)
                      (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
            local_100._0_8_ = this_00;
            if ((ChVectorDynamic<> *)
                (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != pCVar25) goto LAB_007dba1c;
            local_130 = dVar30;
            if ((long)pCVar25 < 0) goto LAB_007db99f;
            local_a0.data = (double *)(local_158 * 0.5);
            local_c0._0_8_ = local_138;
            local_90.data = (double *)pCVar15;
            local_b0 = pCVar25;
            if ((ChVectorDynamic<> *)
                (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != pCVar25) goto LAB_007dba33;
            local_98.m_other = (double)this_00;
            dVar30 = Eigen::
                     MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
                     ::
                     dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
                               ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 *)local_100,
                                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                                 *)local_c0);
          }
          auVar12._8_8_ = uStack_60;
          auVar12._0_8_ = local_68;
          auVar26 = vfmadd213sd_fma(auVar12,auVar12,ZEXT816(0x4010000000000000));
          if (auVar26._0_8_ < 0.0) {
            dVar30 = sqrt(auVar26._0_8_);
          }
          else {
            auVar26 = vsqrtsd_avx(auVar26,auVar26);
            dVar30 = auVar26._0_8_;
          }
          auVar13._8_8_ = uStack_60;
          auVar13._0_8_ = local_68;
          auVar11._8_8_ = 0x8000000000000000;
          auVar11._0_8_ = 0x8000000000000000;
          auVar26 = vxorpd_avx512vl(auVar13,auVar11);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_68 * dVar30;
          auVar26 = vfmadd231sd_fma(auVar32,auVar13,auVar26);
          local_178 = auVar26._0_8_ * 0.5;
          uVar21 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != uVar21) goto LAB_007dba1c;
          if ((long)uVar21 < 0) goto LAB_007db99f;
          pdVar5 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar6 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          if ((this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar21,1);
          }
          pCVar23 = local_108;
          uVar22 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (uVar22 != uVar21) {
            pcVar19 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
            ;
            goto LAB_007dba81;
          }
          auVar14._8_8_ = uStack_60;
          auVar14._0_8_ = local_68;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_178;
          auVar26 = vfmadd213sd_fma(auVar14,auVar14,auVar3);
          auVar33._0_8_ = (local_68 * (1.0 - local_68)) / auVar26._0_8_;
          auVar33._8_8_ = 0;
          pdVar7 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar21 = uVar22 + 7;
          if (-1 < (long)uVar22) {
            uVar21 = uVar22;
          }
          uVar21 = uVar21 & 0xfffffffffffffff8;
          if (7 < (long)uVar22) {
            auVar27 = vbroadcastsd_avx512f(auVar33);
            lVar24 = 0;
            do {
              auVar28 = *(undefined1 (*) [64])(pdVar5 + lVar24);
              auVar29 = vsubpd_avx512f(auVar28,*(undefined1 (*) [64])(pdVar6 + lVar24));
              auVar29 = vmulpd_avx512f(auVar27,auVar29);
              auVar28 = vaddpd_avx512f(auVar28,auVar29);
              *(undefined1 (*) [64])(pdVar7 + lVar24) = auVar28;
              lVar24 = lVar24 + 8;
            } while (lVar24 < (long)uVar21);
          }
          if ((long)uVar21 < (long)uVar22) {
            do {
              dVar30 = pdVar5[uVar21];
              pdVar7[uVar21] = dVar30 + auVar33._0_8_ * (dVar30 - pdVar6[uVar21]);
              uVar21 = uVar21 + 1;
            } while (uVar22 != uVar21);
          }
          dVar30 = Res4(this,local_108);
          pCVar25 = local_140;
          if (dVar30 < this->residual) {
            this->residual = dVar30;
            pdVar5 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data;
            uVar21 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
            if ((this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != uVar21) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         uVar21,1);
            }
            uVar22 = (this->gamma_hat).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (uVar22 != uVar21) goto LAB_007dba8e;
            pdVar6 = (local_110->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            uVar21 = uVar22 + 7;
            if (-1 < (long)uVar22) {
              uVar21 = uVar22;
            }
            uVar21 = uVar21 & 0xfffffffffffffff8;
            if (7 < (long)uVar22) {
              lVar24 = 0;
              do {
                *(undefined1 (*) [64])(pdVar6 + lVar24) = *(undefined1 (*) [64])(pdVar5 + lVar24);
                lVar24 = lVar24 + 8;
              } while (lVar24 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar22) {
              do {
                pdVar6[uVar21] = pdVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar22 != uVar21);
            }
          }
          local_130 = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
          local_38 = this->residual;
          if (local_130 <= local_38) {
            lVar24 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != lVar24) goto LAB_007dba1c;
            if ((this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != lVar24) {
              pcVar19 = 
              "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_007db9ed;
            }
            local_100._0_8_ = local_138;
            local_100._16_8_ = local_160.data;
            lVar24 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            local_100._8_8_ = this_00;
            if (lVar24 != 0) {
              if (lVar24 < 1) {
                pcVar19 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007dba0f;
              }
              local_c0._8_8_ =
                   (local_138->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
              local_a8.m_value =
                   (long)(this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
              local_a0.data = (double *)*local_160.data;
              SVar31 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                       ::
                       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                 ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                   *)local_c0,&local_179,
                                  (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_100);
              if (0.0 < SVar31) {
                pdVar5 = (this->gammaNew).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                uVar21 = (this->gammaNew).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows;
                if ((this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows != uVar21) {
                  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_170->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar21,
                             1);
                }
                uVar22 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         .m_storage.m_rows;
                if (uVar22 != uVar21) goto LAB_007dba8e;
                pdVar6 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                         .m_storage.m_data;
                uVar21 = uVar22 + 7;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                uVar21 = uVar21 & 0xfffffffffffffff8;
                if (7 < (long)uVar22) {
                  lVar24 = 0;
                  do {
                    *(undefined1 (*) [64])(pdVar6 + lVar24) =
                         *(undefined1 (*) [64])(pdVar5 + lVar24);
                    lVar24 = lVar24 + 8;
                  } while (lVar24 < (long)uVar21);
                }
                local_178 = 1.0;
                if ((long)uVar21 < (long)uVar22) {
                  do {
                    pdVar6[uVar21] = pdVar5[uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar22 != uVar21);
                  local_178 = 1.0;
                }
              }
            }
            local_158 = local_158 * 0.9;
            if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
              lVar24 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows != lVar24) goto LAB_007dba1c;
              dVar30 = this->residual;
              if (lVar24 == 0) {
                mdeltalambda = 0.0;
              }
              else {
                local_b0 = (ChVectorDynamic<> *)local_160.data;
                local_128 = dVar30;
                local_c0._8_8_ = this_00;
                if ((this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows < 1) {
                  pcVar19 = 
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                  ;
                  goto LAB_007dba0f;
                }
                local_100._16_8_ =
                     (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
                local_e8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_160.data)->
                     m_storage).m_data;
                mdeltalambda = Eigen::internal::
                               redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                               ::
                               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                           *)local_100,
                                          (scalar_max_op<double,_double,_0> *)&local_179,
                                          (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)local_c0);
                dVar30 = local_128;
              }
              ChIterativeSolverVI::AtIterationEnd
                        (&this->super_ChIterativeSolverVI,dVar30,mdeltalambda,
                         (this->super_ChIterativeSolverVI).m_iterations);
            }
            pdVar5 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data;
            uVar21 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
            if ((this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != uVar21) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_160.data,
                         uVar21,1);
            }
            uVar22 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (uVar22 != uVar21) goto LAB_007dba8e;
            pdVar6 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_160.data)->
                     m_storage).m_data;
            uVar21 = uVar22 + 7;
            if (-1 < (long)uVar22) {
              uVar21 = uVar22;
            }
            uVar21 = uVar21 & 0xfffffffffffffff8;
            if (7 < (long)uVar22) {
              lVar24 = 0;
              do {
                *(undefined1 (*) [64])(pdVar6 + lVar24) = *(undefined1 (*) [64])(pdVar5 + lVar24);
                lVar24 = lVar24 + 8;
              } while (lVar24 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar22) {
              do {
                pdVar6[uVar21] = pdVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar22 != uVar21);
            }
            pdVar5 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            uVar21 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != uVar21) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         uVar21,1);
            }
            uVar22 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (uVar22 != uVar21) goto LAB_007dba8e;
            pdVar6 = (pCVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            uVar21 = uVar22 + 7;
            if (-1 < (long)uVar22) {
              uVar21 = uVar22;
            }
            uVar21 = uVar21 & 0xfffffffffffffff8;
            if (7 < (long)uVar22) {
              lVar24 = 0;
              do {
                *(undefined1 (*) [64])(pdVar6 + lVar24) = *(undefined1 (*) [64])(pdVar5 + lVar24);
                lVar24 = lVar24 + 8;
              } while (lVar24 < (long)uVar21);
            }
            local_128 = 1.0 / local_158;
            uStack_120 = 0;
            if ((long)uVar21 < (long)uVar22) {
              do {
                pdVar6[uVar21] = pdVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar22 != uVar21);
            }
            local_68 = local_178;
            uStack_60 = 0;
          }
        } while ((local_130 <= local_38) &&
                (iVar17 = (this->super_ChIterativeSolverVI).m_iterations + 1,
                (this->super_ChIterativeSolverVI).m_iterations = iVar17,
                iVar17 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations)
                );
      }
      (*pCVar23->_vptr_ChSystemDescriptor[0x13])(pCVar23,local_110);
      (*pCVar23->_vptr_ChSystemDescriptor[0x11])(pCVar23,local_48);
      ppCVar18 = (pCVar23->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pCVar23->vconstraints).
          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppCVar18) {
        uVar21 = 0;
        do {
          pCVar9 = ppCVar18[uVar21];
          if (pCVar9->active == true) {
            (*pCVar9->_vptr_ChConstraint[8])(pCVar9->l_i);
          }
          uVar21 = uVar21 + 1;
          ppCVar18 = (pCVar23->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)(pCVar23->vconstraints).
                                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar18
                                 >> 3));
      }
      local_158 = this->residual;
      if (local_48[0] == 0) {
        return local_158;
      }
      free(*(void **)(local_48[0] + -8));
      return local_158;
    }
  }
  pcVar19 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_007db9b4:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar19);
}

Assistant:

double ChSolverAPGD::Solve(ChSystemDescriptor& sysd) {
    bool verbose = false;
    const std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    const std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();
    if (verbose)
        std::cout << "Number of constraints: " << mconstraints.size()
                  << "\nNumber of variables  : " << mvariables.size() << std::endl;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    double L, t;
    double theta;
    double thetaNew;
    double Beta;
    double obj1, obj2;

    nc = sysd.CountActiveConstraints();
    gamma_hat.resize(nc);
    gammaNew.resize(nc);
    g.resize(nc);
    y.resize(nc);
    gamma.resize(nc);
    yNew.resize(nc);
    r.resize(nc);
    tmp.resize(nc);

    residual = 10e30;

    Beta = 0.0;
    obj1 = 0.0;
    obj2 = 0.0;

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    ShurBvectorCompute(sysd);

    // If no constraints, return now. Variables contain M^-1 * f after call to ShurBvectorCompute.
    // This early exit is needed, else we get division by zero and a potential infinite loop.
    if (nc == 0) {
        return 0;
    }

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> Minvk;
    sysd.FromVariablesToVector(Minvk, true);

    // (1) gamma_0 = zeros(nc,1)
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }
    sysd.FromConstraintsToVector(gamma);

    // (2) gamma_hat_0 = ones(nc,1)
    gamma_hat.setConstant(1.0);

    // (3) y_0 = gamma_0
    y = gamma;

    // (4) theta_0 = 1
    theta = 1.0;

    // (5) L_k = norm(N * (gamma_0 - gamma_hat_0)) / norm(gamma_0 - gamma_hat_0)
    tmp = gamma - gamma_hat;
    L = tmp.norm();
    sysd.ShurComplementProduct(yNew, tmp, nullptr);  // yNew = N * tmp = N * (gamma - gamma_hat)
    L = yNew.norm() / L;
    yNew.setZero();  //// RADU  is this really necessary here?

    // (6) t_k = 1 / L_k
    t = 1.0 / L;

    //// RADU
    //// Check correctness (e.g. sign of 'r' in comments vs. code)

    // (7) for k := 0 to N_max
    for (m_iterations = 0; m_iterations < m_max_iterations; m_iterations++) {
        // (8) g = N * y_k - r
        // (9) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
        sysd.ShurComplementProduct(g, y);  // g = N * y
        gammaNew = y - t * (g + r);
        sysd.ConstraintsProject(gammaNew);

        // (10) while 0.5 * gamma_(k+1)' * N * gamma_(k+1) - gamma_(k+1)' * r >=
        //            0.5 * y_k' * N * y_k - y_k' * r + g' * (gamma_(k+1) - y_k) + 0.5 * L_k * norm(gamma_(k+1) - y_k)^2
        sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
        obj1 = gammaNew.dot(0.5 * tmp + r);

        sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
        obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));

        while (obj1 >= obj2) {
            // (11) L_k = 2 * L_k
            L = 2.0 * L;

            // (12) t_k = 1 / L_k
            t = 1.0 / L;

            // (13) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
            gammaNew = y - t * g;
            sysd.ConstraintsProject(gammaNew);

            // Update obj1 and obj2
            sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
            obj1 = gammaNew.dot(0.5 * tmp + r);

            sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
            obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));
        }  // (14) endwhile

        // (15) theta_(k+1) = (-theta_k^2 + theta_k * sqrt(theta_k^2 + 4)) / 2
        thetaNew = (-theta * theta + theta * sqrt(theta * theta + 4.0)) / 2.0;

        // (16) Beta_(k+1) = theta_k * (1 - theta_k) / (theta_k^2 + theta_(k+1))
        Beta = theta * (1.0 - theta) / (theta * theta + thetaNew);

        // (17) y_(k+1) = gamma_(k+1) + Beta_(k+1) * (gamma_(k+1) - gamma_k)
        yNew = gammaNew + Beta * (gammaNew - gamma);

        // (18) r = r(gamma_(k+1))
        double res = Res4(sysd);

        if (res < residual) {      // (19) if r < epsilon_min
            residual = res;        // (20) r_min = r
            gamma_hat = gammaNew;  // (21) gamma_hat = gamma_(k+1)
        }                          // (22) endif

        if (residual < m_tolerance) {  // (23) if r < Tau
            break;                         // (24) break
        }                                  // (25) endif

        if (g.dot(gammaNew - gamma) > 0) {  // (26) if g' * (gamma_(k+1) - gamma_k) > 0
            yNew = gammaNew;                // (27) y_(k+1) = gamma_(k+1)
            thetaNew = 1.0;                 // (28) theta_(k+1) = 1
        }                                   // (29) endif

        // (30) L_k = 0.9 * L_k
        L = 0.9 * L;

        // (31) t_k = 1 / L_k
        t = 1.0 / L;

        // perform some tasks at the end of the iteration
        if (this->record_violation_history) {
            AtIterationEnd(residual, (gammaNew - gamma).lpNorm<Eigen::Infinity>(), m_iterations);
        }

        // Update iterates
        theta = thetaNew;
        gamma = gammaNew;
        y = yNew;
    }  // (32) endfor

    if (verbose)
        std::cout << "Residual: " << residual << ", Iter: " << m_iterations << std::endl;

    // (33) return Value at time step t_(l+1), gamma_(l+1) := gamma_hat
    sysd.FromVectorToConstraints(gamma_hat);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)
    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed at the beginning)
    sysd.FromVectorToVariables(Minvk);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (size_t ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    return residual;
}